

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int mtree_entry_tree_add(archive_write *a,mtree_entry_conflict **filep)

{
  mtree_writer *mtree_00;
  mtree_entry_conflict *file_00;
  char *__s2;
  int iVar1;
  char *pcVar2;
  undefined1 local_180 [8];
  archive_string as;
  mtree_entry_conflict *vp;
  int r;
  int l;
  char *p;
  char *fn;
  mtree_entry_conflict *np;
  mtree_entry_conflict *file;
  mtree_entry_conflict *dent;
  mtree_writer *mtree;
  char name [256];
  mtree_entry_conflict **filep_local;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  file_00 = *filep;
  if ((((file_00->parentdir).length == 0) && ((file_00->basename).length == 1)) &&
     (*(file_00->basename).s == '.')) {
    file_00->parent = file_00;
    if (mtree_00->root == (mtree_entry_conflict *)0x0) {
      mtree_00->root = file_00;
      mtree_entry_register_add(mtree_00,file_00);
      return 0;
    }
    fn = (char *)mtree_00->root;
  }
  else {
    if ((file_00->parentdir).length == 0) {
      archive_set_error(&a->archive,-1,
                        "Internal programing error in generating canonical name for %s",
                        (file_00->pathname).s);
      return -0x19;
    }
    __s2 = (file_00->parentdir).s;
    if (((mtree_00->cur_dirstr).length == (file_00->parentdir).length) &&
       (iVar1 = strcmp((mtree_00->cur_dirstr).s,__s2), iVar1 == 0)) {
      iVar1 = __archive_rb_tree_insert_node
                        (&mtree_00->cur_dirent->dir_info->rbtree,&file_00->rbnode);
      if (iVar1 != 0) {
        file_00->parent = mtree_00->cur_dirent;
        mtree_entry_register_add(mtree_00,file_00);
        return 0;
      }
      fn = (char *)__archive_rb_tree_find_node
                             (&mtree_00->cur_dirent->dir_info->rbtree,(file_00->basename).s);
    }
    else {
      file = mtree_00->root;
      pcVar2 = __s2;
      while (p = pcVar2, vp._4_4_ = get_path_component((char *)&mtree,0x100,p), vp._4_4_ != 0) {
        if (vp._4_4_ < 0) {
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          return -0x1e;
        }
        if (((vp._4_4_ == 1) && ((char)mtree == '.')) &&
           ((file != (mtree_entry_conflict *)0x0 && (file == mtree_00->root)))) {
          pcVar2 = p + 1;
          if (p[1] == '/') {
            pcVar2 = p + 2;
          }
        }
        else {
          fn = (char *)mtree_entry_find_child(file,(char *)&mtree);
          if (((mtree_entry_conflict *)fn == (mtree_entry_conflict *)0x0) || (*p == '\0'))
          goto LAB_0088ae74;
          if (((mtree_entry_conflict *)fn)->dir_info == (dir_info *)0x0) {
            archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                              (((mtree_entry_conflict *)fn)->pathname).s,(file_00->pathname).s);
            return -0x19;
          }
          pcVar2 = p + vp._4_4_;
          file = (mtree_entry_conflict *)fn;
          if (*pcVar2 == '/') {
            pcVar2 = pcVar2 + 1;
          }
        }
      }
      fn = (char *)0x0;
LAB_0088ae74:
      if (fn == (char *)0x0) {
        while (*p != '\0') {
          local_180 = (undefined1  [8])0x0;
          as.s = (char *)0x0;
          as.length = 0;
          archive_strncat((archive_string *)local_180,__s2,
                          (size_t)(p + ((long)vp._4_4_ - (long)__s2)));
          if (*(char *)((long)local_180 + (long)(as.s + -1)) == '/') {
            *(char *)((long)local_180 + (long)(as.s + -1)) = '\0';
            as.s = as.s + -1;
          }
          iVar1 = mtree_entry_create_virtual_dir
                            (a,(char *)local_180,(mtree_entry_conflict **)&as.buffer_length);
          archive_string_free((archive_string *)local_180);
          if (iVar1 < -0x14) {
            return iVar1;
          }
          iVar1 = strcmp(*(char **)(as.buffer_length + 0x68),".");
          if (iVar1 == 0) {
            *(size_t *)(as.buffer_length + 0x20) = as.buffer_length;
            mtree_00->root = (mtree_entry_conflict *)as.buffer_length;
          }
          else {
            __archive_rb_tree_insert_node
                      (&file->dir_info->rbtree,(archive_rb_node *)as.buffer_length);
            *(mtree_entry_conflict **)(as.buffer_length + 0x20) = file;
          }
          mtree_entry_register_add(mtree_00,(mtree_entry_conflict *)as.buffer_length);
          file = (mtree_entry_conflict *)as.buffer_length;
          p = p + vp._4_4_;
          if (*p == '/') {
            p = p + 1;
          }
          vp._4_4_ = get_path_component((char *)&mtree,0x100,p);
          if (vp._4_4_ < 0) {
            archive_string_free((archive_string *)local_180);
            archive_set_error(&a->archive,-1,"A name buffer is too small");
            return -0x1e;
          }
        }
        mtree_00->cur_dirent = file;
        (mtree_00->cur_dirstr).length = 0;
        archive_string_ensure
                  (&mtree_00->cur_dirstr,(file->parentdir).length + (file->basename).length + 2);
        if ((file->parentdir).length + (file->basename).length == 0) {
          *(mtree_00->cur_dirstr).s = '\0';
        }
        else {
          if ((file->parentdir).length != 0) {
            (mtree_00->cur_dirstr).length = 0;
            archive_string_concat(&mtree_00->cur_dirstr,&file->parentdir);
            archive_strappend_char(&mtree_00->cur_dirstr,'/');
          }
          archive_string_concat(&mtree_00->cur_dirstr,&file->basename);
        }
        iVar1 = __archive_rb_tree_insert_node(&file->dir_info->rbtree,&file_00->rbnode);
        if (iVar1 != 0) {
          file_00->parent = file;
          mtree_entry_register_add(mtree_00,file_00);
          return 0;
        }
        fn = (char *)__archive_rb_tree_find_node(&file->dir_info->rbtree,(file_00->basename).s);
      }
    }
  }
  a_local._4_4_ = mtree_entry_exchange_same_entry(a,(mtree_entry_conflict *)fn,file_00);
  if (-0x15 < a_local._4_4_) {
    if (*(long *)(fn + 0x28) != 0) {
      *(undefined4 *)(*(long *)(fn + 0x28) + 0x28) = 0;
    }
    *filep = (mtree_entry_conflict *)fn;
    mtree_entry_free(file_00);
    a_local._4_4_ = -0x14;
  }
  return a_local._4_4_;
}

Assistant:

static int
mtree_entry_tree_add(struct archive_write *a, struct mtree_entry **filep)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct mtree_writer *mtree = (struct mtree_writer *)a->format_data;
	struct mtree_entry *dent, *file, *np;
	const char *fn, *p;
	int l, r;

	file = *filep;
	if (file->parentdir.length == 0 && file->basename.length == 1 &&
	    file->basename.s[0] == '.') {
		file->parent = file;
		if (mtree->root != NULL) {
			np = mtree->root;
			goto same_entry;
		}
		mtree->root = file;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

	if (file->parentdir.length == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal programing error "
		    "in generating canonical name for %s",
		    file->pathname.s);
		return (ARCHIVE_FAILED);
	}

	fn = p = file->parentdir.s;

	/*
	 * If the path of the parent directory of `file' entry is
	 * the same as the path of `cur_dirent', add `file' entry to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(mtree->cur_dirstr))
	      == archive_strlen(&(file->parentdir)) &&
	    strcmp(mtree->cur_dirstr.s, fn) == 0) {
		if (!__archive_rb_tree_insert_node(
		    &(mtree->cur_dirent->dir_info->rbtree),
		    (struct archive_rb_node *)file)) {
			/* There is the same name in the tree. */
			np = (struct mtree_entry *)__archive_rb_tree_find_node(
			    &(mtree->cur_dirent->dir_info->rbtree),
			    file->basename.s);
			goto same_entry;
		}
		file->parent = mtree->cur_dirent;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

	dent = mtree->root;
	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			return (ARCHIVE_FATAL);
		}
		if (l == 1 && name[0] == '.' && dent != NULL &&
		    dent == mtree->root) {
			fn += l;
			if (fn[0] == '/')
				fn++;
			continue;
		}

		np = mtree_entry_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next sub directory. */
		if (!np->dir_info) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    np->pathname.s, file->pathname.s);
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct mtree_entry *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			r = mtree_entry_create_virtual_dir(a, as.s, &vp);
			archive_string_free(&as);
			if (r < ARCHIVE_WARN)
				return (r);

			if (strcmp(vp->pathname.s, ".") == 0) {
				vp->parent = vp;
				mtree->root = vp;
			} else {
				__archive_rb_tree_insert_node(
				    &(dent->dir_info->rbtree),
				    (struct archive_rb_node *)vp);
				vp->parent = dent;
			}
			mtree_entry_register_add(mtree, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where `file' can be
		 * inserted. */
		mtree->cur_dirent = dent;
		archive_string_empty(&(mtree->cur_dirstr));
		archive_string_ensure(&(mtree->cur_dirstr),
		    archive_strlen(&(dent->parentdir)) +
		    archive_strlen(&(dent->basename)) + 2);
		if (archive_strlen(&(dent->parentdir)) +
		    archive_strlen(&(dent->basename)) == 0)
			mtree->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->parentdir)) > 0) {
				archive_string_copy(&(mtree->cur_dirstr),
				    &(dent->parentdir));
				archive_strappend_char(
				    &(mtree->cur_dirstr), '/');
			}
			archive_string_concat(&(mtree->cur_dirstr),
			    &(dent->basename));
		}

		if (!__archive_rb_tree_insert_node(
		    &(dent->dir_info->rbtree),
		    (struct archive_rb_node *)file)) {
			np = (struct mtree_entry *)__archive_rb_tree_find_node(
			    &(dent->dir_info->rbtree), file->basename.s);
			goto same_entry;
		}
		file->parent = dent;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	r = mtree_entry_exchange_same_entry(a, np, file);
	if (r < ARCHIVE_WARN)
		return (r);
	if (np->dir_info)
		np->dir_info->virtual = 0;
	*filep = np;
	mtree_entry_free(file);
	return (ARCHIVE_WARN);
}